

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O2

FUNCTION_RETURN generate_disk_pc_id(PcIdentifier *identifiers,uint *num_identifiers,_Bool use_label)

{
  FUNCTION_RETURN FVar1;
  DiskInfo *diskInfos;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  size_t disk_num;
  
  FVar1 = getDiskInfos((DiskInfo *)0x0,&disk_num);
  if (FVar1 == FUNC_RET_OK) {
    diskInfos = (DiskInfo *)calloc(1,disk_num * 0x20c);
    FVar1 = getDiskInfos(diskInfos,&disk_num);
    if (FVar1 == FUNC_RET_OK) {
      uVar2 = 0;
      for (uVar3 = 0; uVar3 < disk_num; uVar3 = uVar3 + 1) {
        uVar2 = (uVar2 + 1) - (ulong)(diskInfos[uVar3].disk_sn[(ulong)use_label * 8] == '\0');
      }
      uVar3 = *num_identifiers;
      *num_identifiers = (uint)uVar2;
      if (identifiers == (PcIdentifier *)0x0) {
        FVar1 = FUNC_RET_OK;
      }
      else if ((ulong)(long)(int)uVar3 < uVar2) {
        FVar1 = FUNC_RET_BUFFER_TOO_SMALL;
      }
      else {
        FVar1 = FUNC_RET_OK;
        uVar2 = 0;
        for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < disk_num; uVar3 = uVar3 + 1) {
          if (use_label) {
            if (diskInfos[uVar4].label[0] != '\0') {
              strncpy((char *)(identifiers + uVar2),diskInfos[uVar4].label,6);
LAB_002d1fe6:
              uVar2 = (ulong)((int)uVar2 + 1);
            }
          }
          else if (diskInfos[uVar4].disk_sn[0] != '\0') {
            *(undefined2 *)(identifiers[uVar2] + 4) = *(undefined2 *)(diskInfos[uVar4].disk_sn + 6);
            *(undefined4 *)identifiers[uVar2] = *(undefined4 *)(diskInfos[uVar4].disk_sn + 2);
            goto LAB_002d1fe6;
          }
        }
      }
    }
    free(diskInfos);
  }
  return FVar1;
}

Assistant:

static FUNCTION_RETURN generate_disk_pc_id(PcIdentifier * identifiers,
		unsigned int * num_identifiers, bool use_label) {
	size_t disk_num, available_disk_info = 0;
	FUNCTION_RETURN result_diskinfos;
	unsigned int i, j;
	int defined_identifiers;
	char firstChar;
	DiskInfo * diskInfos;

	result_diskinfos = getDiskInfos(NULL, &disk_num);
	if (result_diskinfos != FUNC_RET_OK) {
		return result_diskinfos;
	}
	diskInfos = (DiskInfo*) malloc(disk_num * sizeof(DiskInfo));
	memset(diskInfos,0,disk_num * sizeof(DiskInfo));
	result_diskinfos = getDiskInfos(diskInfos, &disk_num);
	if (result_diskinfos != FUNC_RET_OK) {
		free(diskInfos);
		return result_diskinfos;
	}
	for (i = 0; i < disk_num; i++) {
		firstChar = use_label ? diskInfos[i].label[0] : diskInfos[i].disk_sn[0];
		available_disk_info += firstChar == 0 ? 0 : 1;
	}

	defined_identifiers = *num_identifiers;
	*num_identifiers = available_disk_info;
	if (identifiers == NULL) {
		free(diskInfos);
		return FUNC_RET_OK;
	} else if (available_disk_info > defined_identifiers) {
		free(diskInfos);
		return FUNC_RET_BUFFER_TOO_SMALL;
	}

	j = 0;
	for (i = 0; i < disk_num; i++) {
		if (use_label) {
			if (diskInfos[i].label[0] != 0) {
				memset(identifiers[j], 0, sizeof(PcIdentifier)); //!!!!!!!
				strncpy((char*)identifiers[j], diskInfos[i].label,
						sizeof(PcIdentifier));
				j++;
			}
		} else {
			if (diskInfos[i].disk_sn[0] != 0) {
				memcpy(identifiers[j], &diskInfos[i].disk_sn[2],
						sizeof(PcIdentifier));
				j++;
			}
		}
	}
	free(diskInfos);
	return FUNC_RET_OK;
}